

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

CAmount AmountFromValue(UniValue *value,int decimals)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  __sv_type val;
  CAmount amount;
  UniValue *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  int64_t *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  int decimals_00;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff50 [16];
  CAmount local_78;
  
  decimals_00 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = UniValue::isNum(in_stack_ffffffffffffff08);
  if (!bVar2) {
    bVar2 = UniValue::isStr(in_stack_ffffffffffffff08);
    if (!bVar2) {
      uVar3 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff50._8_8_,in_stack_ffffffffffffff50._0_8_,
                 (allocator<char> *)
                 CONCAT17(in_stack_ffffffffffffff4f,
                          CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
      JSONRPCError(in_stack_ffffffffffffff50._12_4_,
                   (string *)
                   CONCAT17(in_stack_ffffffffffffff4f,
                            CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_006c2720;
    }
  }
  UniValue::getValStr_abi_cxx11_(in_stack_ffffffffffffff08);
  val = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff28);
  bVar2 = ParseFixedPoint(val,decimals_00,in_stack_ffffffffffffff30);
  if (bVar2) {
    bVar2 = MoneyRange((CAmount *)in_stack_ffffffffffffff08);
    if (bVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_78;
      }
    }
    else {
      uVar4 = 1;
      uVar3 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val._M_str,
                 (char *)val._M_len,
                 (allocator<char> *)
                 CONCAT17(in_stack_ffffffffffffff4f,CONCAT16(uVar4,in_stack_ffffffffffffff48)));
      JSONRPCError(val._M_str._4_4_,
                   (string *)
                   CONCAT17(in_stack_ffffffffffffff4f,CONCAT16(uVar4,in_stack_ffffffffffffff48)));
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  else {
    uVar4 = 1;
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val._M_str,
               (char *)val._M_len,
               (allocator<char> *)
               CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
    JSONRPCError(val._M_str._4_4_,
                 (string *)
                 CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
LAB_006c2720:
  __stack_chk_fail();
}

Assistant:

CAmount AmountFromValue(const UniValue& value, int decimals)
{
    if (!value.isNum() && !value.isStr())
        throw JSONRPCError(RPC_TYPE_ERROR, "Amount is not a number or string");
    CAmount amount;
    if (!ParseFixedPoint(value.getValStr(), decimals, &amount))
        throw JSONRPCError(RPC_TYPE_ERROR, "Invalid amount");
    if (!MoneyRange(amount))
        throw JSONRPCError(RPC_TYPE_ERROR, "Amount out of range");
    return amount;
}